

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command_conflict *cmd)

{
  short sVar1;
  int iVar2;
  effect *effect;
  bool bVar3;
  _Bool _Var4;
  int16_t iVar5;
  wchar_t beam_00;
  wchar_t wVar6;
  class_spell_conflict *pcVar7;
  char *dice_string;
  source sVar8;
  source origin;
  source origin_00;
  int local_84;
  wchar_t oops;
  wchar_t boost;
  wchar_t frac;
  wchar_t e;
  class_spell_conflict *spell;
  _Bool failed;
  wchar_t beam;
  _Bool ident;
  command_conflict *pcStack_28;
  wchar_t chance;
  command_conflict *cmd_local;
  wchar_t local_18;
  wchar_t dir_local;
  wchar_t spell_index_local;
  
  failed = false;
  pcStack_28 = cmd;
  cmd_local._4_4_ = dir;
  local_18 = spell_index;
  beam_00 = beam_chance();
  bVar3 = false;
  pcVar7 = spell_by_index(player,local_18);
  iVar5 = spell_chance(local_18);
  beam = (wchar_t)iVar5;
  wVar6 = Rand_div(100);
  if (wVar6 < beam) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
    bVar3 = true;
  }
  else {
    effect = pcVar7->effect;
    sVar8 = source_player();
    origin.which = sVar8.which;
    origin._4_4_ = 0;
    origin.what = sVar8.what;
    _Var4 = effect_do(effect,origin,(object *)0x0,&failed,true,cmd_local._4_4_,beam_00,L'\0',
                      pcStack_28);
    if (!_Var4) {
      return false;
    }
    _Var4 = flag_has_dbg((player->state).pflags,10,0x23,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var4) {
      convert_mana_to_hp(player,pcVar7->smana << 0x10);
    }
    sound(0x95);
    if ((player->spell_flags[local_18] & 2) == 0) {
      iVar2 = pcVar7->sexp;
      player->spell_flags[local_18] = player->spell_flags[local_18] | 2;
      player_exp_gain(player,iVar2 * pcVar7->slevel);
      player->upkeep->redraw = player->upkeep->redraw | 0x200000;
    }
  }
  if ((int)player->csp < pcVar7->smana) {
    iVar2 = pcVar7->smana;
    sVar1 = player->csp;
    player->csp = 0;
    player->csp_frac = 0;
    player_over_exert(player,L'\x02',L'd',(iVar2 - sVar1) * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
  }
  else {
    player->csp = player->csp - (short)pcVar7->smana;
    if ((!bVar3) &&
       (_Var4 = flag_has_dbg((player->state).pflags,10,0x46,"player->state.pflags","(PF_HARMONY)"),
       _Var4)) {
      if (pcVar7->smana / 3 + 3 < 10) {
        local_84 = pcVar7->smana / 3 + 3;
      }
      else {
        local_84 = 10;
      }
      sVar1 = player->mhp;
      sVar8 = source_player();
      origin_00.which = sVar8.which;
      dice_string = format("%d",(ulong)(uint)((local_84 * sVar1) / 100));
      origin_00._4_4_ = 0;
      origin_00.what = sVar8.what;
      effect_simple(L'\x03',origin_00,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
  }
  player->upkeep->redraw = player->upkeep->redraw | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();
	bool failed = false;

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
		failed = true;
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;

		/* Specialty ability Harmony */
		if (!failed && player_has(player, PF_HARMONY)) {
			/* Percentage of max hp to be regained, capped at 10% */
			int frac = MIN(10, 3 + (spell->smana / 3));

			/* Calculate fractional bonus */
			int boost = (frac * player->mhp) / 100;

			/* Apply bonus */
			effect_simple(EF_HEAL_HP, source_player(), format("%d", boost), 0,
						  0, 0, 0, 0, NULL);
		}
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}